

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

bool __thiscall
tinyobj::ObjReader::ParseFromFile(ObjReader *this,string *filename,ObjReaderConfig *config)

{
  ObjReader OVar1;
  long lVar2;
  string mtl_search_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  mtl_search_path._M_dataplus._M_p = (pointer)&mtl_search_path.field_2;
  mtl_search_path._M_string_length = 0;
  mtl_search_path.field_2._M_local_buf[0] = '\0';
  if (*(long *)(config + 0x10) == 0) {
    lVar2 = std::__cxx11::string::find_last_of((char *)filename,0x274fb9);
    if (lVar2 != -1) {
      std::__cxx11::string::substr((ulong)&local_48,(ulong)filename);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&mtl_search_path,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&mtl_search_path);
  }
  OVar1 = (ObjReader)
          LoadObj((attrib_t *)(this + 8),
                  (vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)(this + 0xb0),
                  (vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)(this + 200),
                  (string *)(this + 0xe0),(string *)(this + 0x100),(filename->_M_dataplus)._M_p,
                  mtl_search_path._M_dataplus._M_p,(bool)*config,(bool)config[1]);
  *this = OVar1;
  std::__cxx11::string::~string((string *)&mtl_search_path);
  return (bool)OVar1;
}

Assistant:

bool ObjReader::ParseFromFile(const std::string &filename,
                              const ObjReaderConfig &config) {
  std::string mtl_search_path;

  if (config.mtl_search_path.empty()) {
    //
    // split at last '/'(for unixish system) or '\\'(for windows) to get
    // the base directory of .obj file
    //
    size_t pos = filename.find_last_of("/\\");
    if (pos != std::string::npos) {
      mtl_search_path = filename.substr(0, pos);
    }
  } else {
    mtl_search_path = config.mtl_search_path;
  }

  valid_ = LoadObj(&attrib_, &shapes_, &materials_, &warning_, &error_,
                   filename.c_str(), mtl_search_path.c_str(),
                   config.triangulate, config.vertex_color);

  return valid_;
}